

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parseCWL.cpp
# Opt level: O2

void extractLikeEnv(Classification *result,string *c,size_t *i)

{
  string local_40 [32];
  
  std::__cxx11::string::substr((ulong)local_40,(ulong)c);
  std::__cxx11::string::operator=((string *)&result->behavesLike,local_40);
  std::__cxx11::string::~string(local_40);
  *i = c->_M_string_length;
  return;
}

Assistant:

void extractLikeEnv (Classification &result, string &c, size_t &i) {
    result.behavesLike = c.substr(i, c.size() - i);
    i = c.size();
}